

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::GreaterThanEquals,false,true,true,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  ulong uVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int64_t *piVar10;
  ulong uVar11;
  sel_t sVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  idx_t iVar18;
  long lVar19;
  ulong uVar20;
  int64_t lmonths;
  int64_t lmicros;
  int64_t ldays;
  interval_t *input;
  
  if (count + 0x3f < 0x40) {
    iVar18 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar18 = 0;
    lVar13 = 0;
    uVar17 = 0;
    uVar9 = 0;
    do {
      uVar14 = uVar17;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar20 = uVar17 + 0x40;
        if (count <= uVar17 + 0x40) {
          uVar20 = count;
        }
LAB_014a3942:
        if (uVar17 < uVar20) {
          psVar3 = sel->sel_vector;
          lVar8 = rdata->micros;
          lVar16 = (long)rdata->days + lVar8 / 86400000000;
          lVar7 = lVar16 % 0x1e;
          lVar16 = (long)rdata->months + lVar16 / 0x1e;
          psVar4 = true_sel->sel_vector;
          psVar5 = false_sel->sel_vector;
          piVar10 = &ldata[uVar17].micros;
          do {
            uVar14 = uVar17;
            if (psVar3 != (sel_t *)0x0) {
              uVar14 = (ulong)psVar3[uVar17];
            }
            lVar19 = (long)*(int32_t *)((long)piVar10 + -4) + *piVar10 / 86400000000;
            lVar15 = lVar19 % 0x1e;
            lVar19 = (long)((interval_t *)(piVar10 + -1))->months + lVar19 / 0x1e;
            if (lVar19 < lVar16) {
LAB_014a3a6e:
              bVar6 = false;
            }
            else {
              bVar6 = true;
              if (lVar19 <= lVar16) {
                if (lVar15 < lVar7) goto LAB_014a3a6e;
                bVar6 = lVar8 % 86400000000 <= *piVar10 % 86400000000 || lVar7 < lVar15;
              }
            }
            psVar4[iVar18] = (sel_t)uVar14;
            iVar18 = iVar18 + bVar6;
            psVar5[lVar13] = (sel_t)uVar14;
            lVar13 = (ulong)(bVar6 ^ 1) + lVar13;
            uVar17 = uVar17 + 1;
            piVar10 = piVar10 + 2;
            uVar14 = uVar20;
          } while (uVar20 != uVar17);
        }
      }
      else {
        uVar2 = puVar1[uVar9];
        uVar20 = uVar17 + 0x40;
        if (count <= uVar17 + 0x40) {
          uVar20 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_014a3942;
        if (uVar2 == 0) {
          uVar14 = uVar20;
          if (uVar17 < uVar20) {
            psVar3 = sel->sel_vector;
            psVar4 = false_sel->sel_vector;
            do {
              sVar12 = (sel_t)uVar17;
              if (psVar3 != (sel_t *)0x0) {
                sVar12 = psVar3[uVar17];
              }
              psVar4[lVar13] = sVar12;
              lVar13 = lVar13 + 1;
              uVar17 = uVar17 + 1;
            } while (uVar20 != uVar17);
          }
        }
        else if (uVar17 < uVar20) {
          psVar3 = sel->sel_vector;
          psVar4 = true_sel->sel_vector;
          psVar5 = false_sel->sel_vector;
          piVar10 = &ldata[uVar17].micros;
          uVar11 = 0;
          do {
            if (psVar3 == (sel_t *)0x0) {
              sVar12 = (int)uVar17 + (int)uVar11;
            }
            else {
              sVar12 = psVar3[uVar17 + uVar11];
            }
            if ((uVar2 >> (uVar11 & 0x3f) & 1) == 0) {
LAB_014a3c34:
              bVar6 = false;
            }
            else {
              lVar8 = (long)rdata->days + rdata->micros / 86400000000;
              lVar7 = lVar8 % 0x1e;
              lVar19 = (long)rdata->months + lVar8 / 0x1e;
              lVar8 = (long)*(int32_t *)((long)piVar10 + -4) + *piVar10 / 86400000000;
              lVar16 = lVar8 % 0x1e;
              lVar8 = (long)((interval_t *)(piVar10 + -1))->months + lVar8 / 0x1e;
              if (lVar8 < lVar19) {
                bVar6 = false;
              }
              else {
                bVar6 = true;
                if (lVar8 <= lVar19) {
                  if (lVar16 < lVar7) goto LAB_014a3c34;
                  bVar6 = rdata->micros % 86400000000 <= *piVar10 % 86400000000 || lVar7 < lVar16;
                }
              }
            }
            psVar4[iVar18] = sVar12;
            iVar18 = iVar18 + bVar6;
            psVar5[lVar13] = sVar12;
            lVar13 = (ulong)(bVar6 ^ 1) + lVar13;
            uVar11 = uVar11 + 1;
            piVar10 = piVar10 + 2;
            uVar14 = uVar20;
          } while (uVar20 - uVar17 != uVar11);
        }
      }
      uVar17 = uVar14;
      uVar9 = uVar9 + 1;
    } while (uVar9 != count + 0x3f >> 6);
  }
  return iVar18;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}